

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGranularityTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::GranularityInstance::initRenderPass(GranularityInstance *this)

{
  RefData<vk::Handle<(vk::HandleType)17>_> data;
  RefData<vk::Handle<(vk::HandleType)23>_> data_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  bool bVar1;
  deUint32 queueFamilyIndex_00;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device_00;
  size_type sVar2;
  pointer this_00;
  RefBase<vk::Handle<(vk::HandleType)13>_> *this_01;
  Handle<(vk::HandleType)13> *__x;
  Handle<(vk::HandleType)17> *pHVar3;
  Handle<(vk::HandleType)24> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  undefined8 local_260;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  Move<vk::VkCommandBuffer_s_*> local_238;
  RefData<vk::VkCommandBuffer_s_*> local_218;
  Move<vk::Handle<(vk::HandleType)24>_> local_1f8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_1d8;
  Move<vk::Handle<(vk::HandleType)23>_> local_1b8;
  RefData<vk::Handle<(vk::HandleType)23>_> local_198;
  undefined1 local_178 [8];
  VkFramebufferCreateInfo framebufferParams;
  __normal_iterator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>_>
  local_130;
  __normal_iterator<const_de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>_>
  local_128;
  const_iterator it;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  imageViews;
  Move<vk::Handle<(vk::HandleType)17>_> local_f8;
  RefData<vk::Handle<(vk::HandleType)17>_> local_d8;
  undefined1 local_b8 [8];
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDescription subpassDesc;
  deUint32 queueFamilyIndex;
  VkDevice device;
  DeviceInterface *vk;
  GranularityInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  local_b8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext._0_4_ = 0;
  sVar2 = std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
          size(&this->m_attachmentDescriptions);
  renderPassParams.pNext._4_4_ = (undefined4)sVar2;
  renderPassParams._16_8_ =
       std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
       operator[](&this->m_attachmentDescriptions,0);
  renderPassParams.pAttachments._0_4_ = 1;
  renderPassParams._32_8_ = &renderPassParams.pDependencies;
  renderPassParams.pSubpasses._0_4_ = 0;
  renderPassParams.dependencyCount = 0;
  renderPassParams._52_4_ = 0;
  ::vk::createRenderPass
            (&local_f8,vk_00,device_00,(VkRenderPassCreateInfo *)local_b8,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d8,(Move *)&local_f8);
  data.deleter.m_deviceIface = local_d8.deleter.m_deviceIface;
  data.object.m_internal = local_d8.object.m_internal;
  data.deleter.m_device = local_d8.deleter.m_device;
  data.deleter.m_allocator = local_d8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_f8);
  initImages(this);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *
         )&it);
  local_130._M_current =
       (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
       std::
       vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
       ::begin(&this->m_imageViews);
  __gnu_cxx::
  __normal_iterator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>const*,std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>>
  ::__normal_iterator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>*>
            ((__normal_iterator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>const*,std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>>
              *)&local_128,&local_130);
  while( true ) {
    framebufferParams._56_8_ =
         std::
         vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
         ::end(&this->m_imageViews);
    bVar1 = __gnu_cxx::operator!=
                      (&local_128,
                       (__normal_iterator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>_>
                        *)&framebufferParams.layers);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>_>
              ::operator->(&local_128);
    this_01 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::get(this_00)
               ->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    __x = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::get(this_01);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    push_back((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               *)&it,__x);
    __gnu_cxx::
    __normal_iterator<const_de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_*,_std::vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>_>
    ::operator++(&local_128);
  }
  local_178._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferParams._4_4_ = 0;
  framebufferParams.pNext._0_4_ = 0;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  framebufferParams._16_8_ = pHVar3->m_internal;
  sVar2 = std::
          vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
          size((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                *)&it);
  framebufferParams.renderPass.m_internal._0_4_ = (undefined4)sVar2;
  framebufferParams._32_8_ =
       std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ::operator[]((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                     *)&it,0);
  framebufferParams.pAttachments._0_4_ = 1;
  framebufferParams.pAttachments._4_4_ = 1;
  framebufferParams.width = 1;
  ::vk::createFramebuffer
            (&local_1b8,vk_00,device_00,(VkFramebufferCreateInfo *)local_178,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_198,(Move *)&local_1b8);
  data_00.deleter.m_deviceIface = local_198.deleter.m_deviceIface;
  data_00.object.m_internal = local_198.object.m_internal;
  data_00.deleter.m_device = local_198.deleter.m_device;
  data_00.deleter.m_allocator = local_198.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_frameBuffer,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_1b8);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
           *)&it);
  ::vk::createCommandPool
            (&local_1f8,vk_00,device_00,1,queueFamilyIndex_00,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)&local_1f8);
  data_01.deleter.m_deviceIface = local_1d8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1d8.object.m_internal;
  data_01.deleter.m_device = local_1d8.deleter.m_device;
  data_01.deleter.m_allocator = local_1d8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_cmdPool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_1f8);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)pHVar4->m_internal;
  ::vk::allocateCommandBuffer
            (&local_238,vk_00,device_00,(VkCommandPool)cmdBufferBeginInfo.pInheritanceInfo,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_218,(Move *)&local_238);
  data_02.deleter.m_deviceIface = local_218.deleter.m_deviceIface;
  data_02.object = local_218.object;
  data_02.deleter.m_device = local_218.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_218.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=(&this->m_cmdBuffer,data_02);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_238);
  local_260 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  result = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar5,&local_260);
  ::vk::checkResult(result,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiGranularityTests.cpp"
                    ,0x139);
  return;
}

Assistant:

void GranularityInstance::initRenderPass (void)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	{	// Create RenderPass
		const VkSubpassDescription	subpassDesc =
		{
			(VkSubpassDescriptionFlags)0u,		// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,	// VkPipelineBindPoint				pipelineBindPoint;
			0u,									// deUint32							inputCount;
			DE_NULL,							// const VkAttachmentReference*		pInputAttachments;
			0u,									// deUint32							colorCount;
			DE_NULL,							// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,							// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,							// VkAttachmentReference			depthStencilAttachment;
			0u,									// deUint32							preserveCount;
			DE_NULL								// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo	renderPassParams =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,	// VkStructureType					sType;
			DE_NULL,									// const void*						pNext;
			(VkRenderPassCreateFlags)0,					// VkRenderPassCreateFlags			flags;
			(deUint32)m_attachmentDescriptions.size(),	// deUint32							attachmentCount;
			&m_attachmentDescriptions[0],				// const VkAttachmentDescription*	pAttachments;
			1u,											// deUint32							subpassCount;
			&subpassDesc,								// const VkSubpassDescription*		pSubpasses;
			0u,											// deUint32							dependencyCount;
			DE_NULL										// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass	= createRenderPass(vk, device, &renderPassParams);
	}

	initImages();

	{	// Create Framebuffer
		std::vector<VkImageView>	imageViews;

		for (std::vector<VkImageViewSp>::const_iterator it = m_imageViews.begin(); it != m_imageViews.end(); ++it)
			imageViews.push_back(it->get()->get());

		const VkFramebufferCreateInfo	framebufferParams	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			(VkFramebufferCreateFlags)0,				// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			(deUint32)imageViews.size(),				// deUint32					attachmentCount;
			&imageViews[0],								// const VkImageView*		pAttachments;
			1,											// deUint32					width;
			1,											// deUint32					height;
			1											// deUint32					layers;
		};

		m_frameBuffer	= createFramebuffer(vk, device, &framebufferParams);
	}

	m_cmdPool	= createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create CommandBuffer
	m_cmdBuffer	= allocateCommandBuffer(vk, device, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	{	// Begin CommandBuffer
		const VkCommandBufferBeginInfo	cmdBufferBeginInfo	=
		{
			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType							sType;
			DE_NULL,										// const void*								pNext;
			0u,												// VkCmdBufferOptimizeFlags					flags;
			DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
		};

		VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	}
}